

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__resample_row_hv_2_simd(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  stbi_uc sVar4;
  int iVar5;
  int in_ECX;
  byte *in_RDX;
  byte *in_RSI;
  stbi_uc *in_RDI;
  ushort uVar6;
  ushort uVar7;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  undefined1 auVar8 [16];
  ushort uVar21;
  ushort uVar22;
  __m128i curb;
  __m128i nxtd;
  __m128i prvd;
  __m128i curs;
  __m128i bias;
  __m128i next;
  __m128i prev;
  __m128i nxt0;
  __m128i prv0;
  __m128i curr;
  __m128i nears;
  __m128i diff;
  __m128i nearw;
  __m128i farw;
  __m128i nearb;
  __m128i farb;
  __m128i zero;
  int t1;
  int t0;
  int i;
  int local_2bc;
  int local_2b4;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  ushort uStack_186;
  ushort uStack_184;
  ushort uStack_182;
  ushort uStack_17e;
  ushort uStack_17c;
  ushort uStack_17a;
  ushort uStack_176;
  ushort uStack_174;
  ushort uStack_172;
  ushort uStack_16e;
  ushort uStack_16c;
  ushort uStack_16a;
  byte local_128;
  byte bStack_127;
  byte bStack_126;
  byte bStack_125;
  byte bStack_124;
  byte bStack_123;
  byte bStack_122;
  byte bStack_121;
  byte local_108;
  byte bStack_107;
  byte bStack_106;
  byte bStack_105;
  byte bStack_104;
  byte bStack_103;
  byte bStack_102;
  byte bStack_101;
  __m128i outv;
  __m128i de1;
  __m128i de0;
  __m128i int1;
  __m128i int0;
  __m128i odd;
  __m128i even;
  
  local_2b4 = 0;
  if (in_ECX == 1) {
    sVar4 = (stbi_uc)((int)((uint)*in_RSI * 3 + (uint)*in_RDX + 2) >> 2);
    in_RDI[1] = sVar4;
    *in_RDI = sVar4;
  }
  else {
    local_2bc = (uint)*in_RSI * 3 + (uint)*in_RDX;
    for (; local_2b4 < (int)(in_ECX - 1U & 0xfffffff8); local_2b4 = local_2b4 + 8) {
      uVar1 = *(undefined8 *)(in_RDX + local_2b4);
      uVar2 = *(undefined8 *)(in_RSI + local_2b4);
      local_108 = (byte)uVar1;
      bStack_107 = (byte)((ulong)uVar1 >> 8);
      bStack_106 = (byte)((ulong)uVar1 >> 0x10);
      bStack_105 = (byte)((ulong)uVar1 >> 0x18);
      bStack_104 = (byte)((ulong)uVar1 >> 0x20);
      bStack_103 = (byte)((ulong)uVar1 >> 0x28);
      bStack_102 = (byte)((ulong)uVar1 >> 0x30);
      bStack_101 = (byte)((ulong)uVar1 >> 0x38);
      local_128 = (byte)uVar2;
      bStack_127 = (byte)((ulong)uVar2 >> 8);
      bStack_126 = (byte)((ulong)uVar2 >> 0x10);
      bStack_125 = (byte)((ulong)uVar2 >> 0x18);
      bStack_124 = (byte)((ulong)uVar2 >> 0x20);
      bStack_123 = (byte)((ulong)uVar2 >> 0x28);
      bStack_122 = (byte)((ulong)uVar2 >> 0x30);
      bStack_121 = (byte)((ulong)uVar2 >> 0x38);
      uStack_176 = (ushort)bStack_107;
      uStack_174 = (ushort)bStack_106;
      uStack_172 = (ushort)bStack_105;
      uStack_16e = (ushort)bStack_103;
      uStack_16c = (ushort)bStack_102;
      uStack_16a = (ushort)bStack_101;
      uStack_186 = (ushort)bStack_127;
      uStack_184 = (ushort)bStack_126;
      uStack_182 = (ushort)bStack_125;
      uStack_17e = (ushort)bStack_123;
      uStack_17c = (ushort)bStack_122;
      uStack_17a = (ushort)bStack_121;
      auVar3[1] = 0;
      auVar3[0] = local_128;
      auVar3[2] = bStack_127;
      auVar3[3] = 0;
      auVar3[4] = bStack_126;
      auVar3[5] = 0;
      auVar3[6] = bStack_125;
      auVar3[7] = 0;
      auVar3[9] = 0;
      auVar3[8] = bStack_124;
      auVar3[10] = bStack_123;
      auVar3[0xb] = 0;
      auVar3[0xc] = bStack_122;
      auVar3[0xd] = 0;
      auVar3[0xe] = bStack_121;
      auVar3[0xf] = 0;
      auVar8 = psllw(auVar3,ZEXT416(2));
      local_1d8 = auVar8._0_2_;
      sStack_1d6 = auVar8._2_2_;
      sStack_1d4 = auVar8._4_2_;
      sStack_1d2 = auVar8._6_2_;
      sStack_1d0 = auVar8._8_2_;
      sStack_1ce = auVar8._10_2_;
      sStack_1cc = auVar8._12_2_;
      sStack_1ca = auVar8._14_2_;
      local_1d8 = local_1d8 + ((ushort)local_108 - (ushort)local_128);
      sStack_1d6 = sStack_1d6 + (uStack_176 - uStack_186);
      sStack_1d4 = sStack_1d4 + (uStack_174 - uStack_184);
      sStack_1d2 = sStack_1d2 + (uStack_172 - uStack_182);
      sStack_1d0 = sStack_1d0 + ((ushort)bStack_104 - (ushort)bStack_124);
      sStack_1ce = sStack_1ce + (uStack_16e - uStack_17e);
      sStack_1cc = sStack_1cc + (uStack_16c - uStack_17c);
      sStack_1ca = sStack_1ca + (uStack_16a - uStack_17a);
      auVar8._2_2_ = sStack_1d6;
      auVar8._0_2_ = local_1d8;
      auVar8._4_2_ = sStack_1d4;
      auVar8._6_2_ = sStack_1d2;
      auVar8._10_2_ = sStack_1ce;
      auVar8._8_2_ = sStack_1d0;
      auVar8._12_2_ = sStack_1cc;
      auVar8._14_2_ = sStack_1ca;
      auVar8 = psllw(auVar8,ZEXT416(2));
      local_1f8 = auVar8._0_2_;
      sStack_1f6 = auVar8._2_2_;
      sStack_1f4 = auVar8._4_2_;
      sStack_1f2 = auVar8._6_2_;
      sStack_1f0 = auVar8._8_2_;
      sStack_1ee = auVar8._10_2_;
      sStack_1ec = auVar8._12_2_;
      sStack_1ea = auVar8._14_2_;
      uVar6 = (ushort)(((short)local_2bc - local_1d8) + local_1f8 + 8) >> 4;
      uVar9 = (ushort)((sStack_1d6 - local_1d8) + local_1f8 + 8) >> 4;
      uVar11 = (ushort)((local_1d8 - sStack_1d6) + sStack_1f6 + 8) >> 4;
      uVar13 = (ushort)((sStack_1d4 - sStack_1d6) + sStack_1f6 + 8) >> 4;
      uVar15 = (ushort)((sStack_1d6 - sStack_1d4) + sStack_1f4 + 8) >> 4;
      uVar17 = (ushort)((sStack_1d2 - sStack_1d4) + sStack_1f4 + 8) >> 4;
      uVar19 = (ushort)((sStack_1d4 - sStack_1d2) + sStack_1f2 + 8) >> 4;
      uVar21 = (ushort)((sStack_1d0 - sStack_1d2) + sStack_1f2 + 8) >> 4;
      uVar7 = (ushort)((sStack_1d2 - sStack_1d0) + sStack_1f0 + 8) >> 4;
      uVar10 = (ushort)((sStack_1ce - sStack_1d0) + sStack_1f0 + 8) >> 4;
      uVar12 = (ushort)((sStack_1d0 - sStack_1ce) + sStack_1ee + 8) >> 4;
      uVar14 = (ushort)((sStack_1cc - sStack_1ce) + sStack_1ee + 8) >> 4;
      uVar16 = (ushort)((sStack_1ce - sStack_1cc) + sStack_1ec + 8) >> 4;
      uVar18 = (ushort)((sStack_1ca - sStack_1cc) + sStack_1ec + 8) >> 4;
      uVar20 = (ushort)((sStack_1cc - sStack_1ca) + sStack_1ea + 8) >> 4;
      uVar22 = (ushort)((((ushort)in_RSI[(long)local_2b4 + 8] +
                          (ushort)in_RSI[(long)local_2b4 + 8] * 2 +
                         (ushort)in_RDX[(long)local_2b4 + 8]) - sStack_1ca) + sStack_1ea + 8) >> 4;
      *(ulong *)(in_RDI + (local_2b4 << 1)) =
           CONCAT17((uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21),
                    CONCAT16((uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19),
                             CONCAT15((uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 -
                                      (0xff < uVar17),
                                      CONCAT14((uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 -
                                               (0xff < uVar15),
                                               CONCAT13((uVar13 != 0) * (uVar13 < 0x100) *
                                                        (char)uVar13 - (0xff < uVar13),
                                                        CONCAT12((uVar11 != 0) * (uVar11 < 0x100) *
                                                                 (char)uVar11 - (0xff < uVar11),
                                                                 CONCAT11((uVar9 != 0) *
                                                                          (uVar9 < 0x100) *
                                                                          (char)uVar9 -
                                                                          (0xff < uVar9),
                                                                          (uVar6 != 0) *
                                                                          (uVar6 < 0x100) *
                                                                          (char)uVar6 -
                                                                          (0xff < uVar6))))))));
      *(ulong *)(in_RDI + (local_2b4 << 1) + 8) =
           CONCAT17((uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22),
                    CONCAT16((uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20),
                             CONCAT15((uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 -
                                      (0xff < uVar18),
                                      CONCAT14((uVar16 != 0) * (uVar16 < 0x100) * (char)uVar16 -
                                               (0xff < uVar16),
                                               CONCAT13((uVar14 != 0) * (uVar14 < 0x100) *
                                                        (char)uVar14 - (0xff < uVar14),
                                                        CONCAT12((uVar12 != 0) * (uVar12 < 0x100) *
                                                                 (char)uVar12 - (0xff < uVar12),
                                                                 CONCAT11((uVar10 != 0) *
                                                                          (uVar10 < 0x100) *
                                                                          (char)uVar10 -
                                                                          (0xff < uVar10),
                                                                          (uVar7 != 0) *
                                                                          (uVar7 < 0x100) *
                                                                          (char)uVar7 -
                                                                          (0xff < uVar7))))))));
      local_2bc = (uint)in_RSI[local_2b4 + 7] * 3 + (uint)in_RDX[local_2b4 + 7];
    }
    iVar5 = (uint)in_RSI[local_2b4] * 3 + (uint)in_RDX[local_2b4];
    in_RDI[local_2b4 << 1] = (stbi_uc)(iVar5 * 3 + local_2bc + 8 >> 4);
    local_2bc = iVar5;
    while (local_2b4 = local_2b4 + 1, local_2b4 < in_ECX) {
      iVar5 = (uint)in_RSI[local_2b4] * 3 + (uint)in_RDX[local_2b4];
      in_RDI[local_2b4 * 2 + -1] = (stbi_uc)(local_2bc * 3 + iVar5 + 8 >> 4);
      in_RDI[local_2b4 * 2] = (stbi_uc)(iVar5 * 3 + local_2bc + 8 >> 4);
      local_2bc = iVar5;
    }
    in_RDI[in_ECX * 2 + -1] = (stbi_uc)(local_2bc + 2 >> 2);
  }
  return in_RDI;
}

Assistant:

static stbi_uc *stbi__resample_row_hv_2_simd(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
   // need to generate 2x2 samples for every one in input
   int i=0,t0,t1;

   if (w == 1) {
      out[0] = out[1] = stbi__div4(3*in_near[0] + in_far[0] + 2);
      return out;
   }

   t1 = 3*in_near[0] + in_far[0];
   // process groups of 8 pixels for as long as we can.
   // note we can't handle the last pixel in a row in this loop
   // because we need to handle the filter boundary conditions.
   for (; i < ((w-1) & ~7); i += 8) {
#if defined(STBI_SSE2)
      // load and perform the vertical filtering pass
      // this uses 3*x + y = 4*x + (y - x)
      __m128i zero  = _mm_setzero_si128();
      __m128i farb  = _mm_loadl_epi64((__m128i *) (in_far + i));
      __m128i nearb = _mm_loadl_epi64((__m128i *) (in_near + i));
      __m128i farw  = _mm_unpacklo_epi8(farb, zero);
      __m128i nearw = _mm_unpacklo_epi8(nearb, zero);
      __m128i diff  = _mm_sub_epi16(farw, nearw);
      __m128i nears = _mm_slli_epi16(nearw, 2);
      __m128i curr  = _mm_add_epi16(nears, diff); // current row

      // horizontal filter works the same based on shifted vers of current
      // row. "prev" is current row shifted right by 1 pixel; we need to
      // insert the previous pixel value (from t1).
      // "next" is current row shifted left by 1 pixel, with first pixel
      // of next block of 8 pixels added in.
      __m128i prv0 = _mm_slli_si128(curr, 2);
      __m128i nxt0 = _mm_srli_si128(curr, 2);
      __m128i prev = _mm_insert_epi16(prv0, t1, 0);
      __m128i next = _mm_insert_epi16(nxt0, 3*in_near[i+8] + in_far[i+8], 7);

      // horizontal filter, polyphase implementation since it's convenient:
      // even pixels = 3*cur + prev = cur*4 + (prev - cur)
      // odd  pixels = 3*cur + next = cur*4 + (next - cur)
      // note the shared term.
      __m128i bias  = _mm_set1_epi16(8);
      __m128i curs = _mm_slli_epi16(curr, 2);
      __m128i prvd = _mm_sub_epi16(prev, curr);
      __m128i nxtd = _mm_sub_epi16(next, curr);
      __m128i curb = _mm_add_epi16(curs, bias);
      __m128i even = _mm_add_epi16(prvd, curb);
      __m128i odd  = _mm_add_epi16(nxtd, curb);

      // interleave even and odd pixels, then undo scaling.
      __m128i int0 = _mm_unpacklo_epi16(even, odd);
      __m128i int1 = _mm_unpackhi_epi16(even, odd);
      __m128i de0  = _mm_srli_epi16(int0, 4);
      __m128i de1  = _mm_srli_epi16(int1, 4);

      // pack and write output
      __m128i outv = _mm_packus_epi16(de0, de1);
      _mm_storeu_si128((__m128i *) (out + i*2), outv);
#elif defined(STBI_NEON)
      // load and perform the vertical filtering pass
      // this uses 3*x + y = 4*x + (y - x)
      uint8x8_t farb  = vld1_u8(in_far + i);
      uint8x8_t nearb = vld1_u8(in_near + i);
      int16x8_t diff  = vreinterpretq_s16_u16(vsubl_u8(farb, nearb));
      int16x8_t nears = vreinterpretq_s16_u16(vshll_n_u8(nearb, 2));
      int16x8_t curr  = vaddq_s16(nears, diff); // current row

      // horizontal filter works the same based on shifted vers of current
      // row. "prev" is current row shifted right by 1 pixel; we need to
      // insert the previous pixel value (from t1).
      // "next" is current row shifted left by 1 pixel, with first pixel
      // of next block of 8 pixels added in.
      int16x8_t prv0 = vextq_s16(curr, curr, 7);
      int16x8_t nxt0 = vextq_s16(curr, curr, 1);
      int16x8_t prev = vsetq_lane_s16(t1, prv0, 0);
      int16x8_t next = vsetq_lane_s16(3*in_near[i+8] + in_far[i+8], nxt0, 7);

      // horizontal filter, polyphase implementation since it's convenient:
      // even pixels = 3*cur + prev = cur*4 + (prev - cur)
      // odd  pixels = 3*cur + next = cur*4 + (next - cur)
      // note the shared term.
      int16x8_t curs = vshlq_n_s16(curr, 2);
      int16x8_t prvd = vsubq_s16(prev, curr);
      int16x8_t nxtd = vsubq_s16(next, curr);
      int16x8_t even = vaddq_s16(curs, prvd);
      int16x8_t odd  = vaddq_s16(curs, nxtd);

      // undo scaling and round, then store with even/odd phases interleaved
      uint8x8x2_t o;
      o.val[0] = vqrshrun_n_s16(even, 4);
      o.val[1] = vqrshrun_n_s16(odd,  4);
      vst2_u8(out + i*2, o);
#endif

      // "previous" value for next iter
      t1 = 3*in_near[i+7] + in_far[i+7];
   }

   t0 = t1;
   t1 = 3*in_near[i] + in_far[i];
   out[i*2] = stbi__div16(3*t1 + t0 + 8);

   for (++i; i < w; ++i) {
      t0 = t1;
      t1 = 3*in_near[i]+in_far[i];
      out[i*2-1] = stbi__div16(3*t0 + t1 + 8);
      out[i*2  ] = stbi__div16(3*t1 + t0 + 8);
   }
   out[w*2-1] = stbi__div4(t1+2);

   STBI_NOTUSED(hs);

   return out;
}